

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natpmp.cpp
# Opt level: O2

void __thiscall libtorrent::natpmp::close_impl(natpmp *this)

{
  pointer pmVar1;
  mapping_t *m;
  pointer pmVar2;
  double in_XMM0_Qa;
  
  this->m_abort = true;
  log(this,in_XMM0_Qa);
  if (this->m_disabled != false) {
    return;
  }
  pmVar1 = (this->m_mappings).
           super_vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
           .
           super__Vector_base<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pmVar2 = (this->m_mappings).
                super_vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
                .
                super__Vector_base<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
                ._M_impl.super__Vector_impl_data._M_start; pmVar2 != pmVar1; pmVar2 = pmVar2 + 1) {
    if ((pmVar2->super_base_mapping).protocol != none) {
      (pmVar2->super_base_mapping).act = del;
    }
  }
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::cancel(&this->m_refresh_timer);
  (this->m_currently_mapping).m_val = -1;
  update_mapping(this,(port_mapping_t)0x0);
  return;
}

Assistant:

void natpmp::close_impl()
{
	TORRENT_ASSERT(is_single_thread());
	m_abort = true;
#ifndef TORRENT_DISABLE_LOGGING
	log("closing");
#endif
	if (m_disabled) return;
	for (auto& m : m_mappings)
	{
		if (m.protocol == portmap_protocol::none) continue;
		m.act = portmap_action::del;
	}
	m_refresh_timer.cancel();
	m_currently_mapping = port_mapping_t{-1};
	update_mapping(port_mapping_t{});
}